

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImFontAtlas::CalcCustomRectUV
          (ImFontAtlas *this,ImFontAtlasCustomRect *rect,ImVec2 *out_uv_min,ImVec2 *out_uv_max)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  ImVec2 IVar8;
  ImVec2 IVar9;
  
  if ((this->TexWidth < 1) || (this->TexHeight < 1)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,2000,"CalcCustomRectUV","ImGui ASSERT FAILED: %s","TexWidth > 0 && TexHeight > 0");
  }
  if (rect->X == 0xffff) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x7d1,"CalcCustomRectUV","ImGui ASSERT FAILED: %s","rect->IsPacked()");
  }
  uVar2._0_2_ = rect->X;
  uVar2._2_2_ = rect->Y;
  IVar9.x = (this->TexUvScale).x * (float)(uVar2 & 0xffff);
  IVar9.y = (this->TexUvScale).y * (float)(uVar2 >> 0x10);
  *out_uv_min = IVar9;
  uVar3._0_2_ = rect->X;
  uVar3._2_2_ = rect->Y;
  uVar1._0_2_ = rect->Width;
  uVar1._2_2_ = rect->Height;
  uVar1._4_2_ = rect->X;
  uVar1._6_2_ = rect->Y;
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4._12_2_ = uVar1._6_2_;
  auVar5._8_2_ = uVar1._4_2_;
  auVar5._0_8_ = uVar1;
  auVar5._10_4_ = auVar4._10_4_;
  auVar7._6_8_ = 0;
  auVar7._0_6_ = auVar5._8_6_;
  auVar6._4_2_ = uVar1._2_2_;
  auVar6._0_4_ = (uint)uVar1;
  auVar6._6_8_ = SUB148(auVar7 << 0x40,6);
  IVar8.x = (this->TexUvScale).x * (float)(((uint)uVar1 & 0xffff) + (uVar3 & 0xffff));
  IVar8.y = (this->TexUvScale).y * (float)(auVar6._4_4_ + (uVar3 >> 0x10));
  *out_uv_max = IVar8;
  return;
}

Assistant:

void ImFontAtlas::CalcCustomRectUV(const ImFontAtlasCustomRect* rect, ImVec2* out_uv_min, ImVec2* out_uv_max) const
{
    IM_ASSERT(TexWidth > 0 && TexHeight > 0);   // Font atlas needs to be built before we can calculate UV coordinates
    IM_ASSERT(rect->IsPacked());                // Make sure the rectangle has been packed
    *out_uv_min = ImVec2((float)rect->X * TexUvScale.x, (float)rect->Y * TexUvScale.y);
    *out_uv_max = ImVec2((float)(rect->X + rect->Width) * TexUvScale.x, (float)(rect->Y + rect->Height) * TexUvScale.y);
}